

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astDoWhileContinueWithNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  bool bVar2;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_30;
  undefined8 local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_30.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_20 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_30);
  do {
    if (*(sysbvm_tuple_t *)(*arguments + 0x28) != 0) {
      sysbvm_interpreter_evaluateASTWithEnvironment
                (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
    }
    if (*(sysbvm_tuple_t *)(*arguments + 0x30) == 0) {
      bVar2 = true;
    }
    else {
      sVar1 = sysbvm_interpreter_evaluateASTWithEnvironment
                        (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
      bVar2 = sVar1 == 0x1f;
    }
    if (!bVar2) {
      sysbvm_gc_safepoint(context);
      break;
    }
    if (*(sysbvm_tuple_t *)(*arguments + 0x38) != 0) {
      sysbvm_interpreter_evaluateASTWithEnvironment
                (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
    }
    sysbvm_gc_safepoint(context);
  } while (bVar2);
  sysbvm_stackFrame_popRecord(&local_30);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDoWhileContinueWithNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astDoWhileContinueWithNode_t **doWhileNode = (sysbvm_astDoWhileContinueWithNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*doWhileNode)->super.sourcePosition);
    bool shouldContinue = false;
    do
    {
        if((*doWhileNode)->bodyExpression)
            sysbvm_interpreter_evaluateASTWithEnvironment(context, (*doWhileNode)->bodyExpression, *environment);
        if((*doWhileNode)->conditionExpression)
            shouldContinue = sysbvm_tuple_boolean_decode(sysbvm_interpreter_evaluateASTWithEnvironment(context, (*doWhileNode)->conditionExpression, *environment));
        else
            shouldContinue = true;

        if(shouldContinue)
        {
            if((*doWhileNode)->continueExpression)
                sysbvm_interpreter_evaluateASTWithEnvironment(context, (*doWhileNode)->continueExpression, *environment);
        }

        sysbvm_gc_safepoint(context);
    } while (shouldContinue);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);

    return SYSBVM_VOID_TUPLE;
}